

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

ImGuiPayload * ImGui::AcceptDragDropPayload(char *type,ImGuiDragDropFlags flags)

{
  ImVec2 IVar1;
  ImVec2 IVar2;
  ImGuiID IVar3;
  ImGuiID IVar4;
  ImGuiWindow *pIVar5;
  ImDrawList *this;
  undefined4 uVar6;
  undefined4 uVar7;
  ImGuiContext *pIVar8;
  bool bVar9;
  int iVar10;
  ImU32 col;
  ImGuiPayload *pIVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  ImVec2 local_58;
  ImVec2 local_50;
  ImVec4 local_48;
  
  pIVar8 = GImGui;
  pIVar5 = GImGui->CurrentWindow;
  if ((type == (char *)0x0) ||
     (((GImGui->DragDropPayload).DataFrameCount != -1 &&
      (iVar10 = strcmp(type,(GImGui->DragDropPayload).DataType), iVar10 == 0)))) {
    IVar3 = pIVar8->DragDropAcceptIdPrev;
    IVar4 = pIVar8->DragDropTargetId;
    IVar1 = (pIVar8->DragDropTargetRect).Min;
    IVar2 = (pIVar8->DragDropTargetRect).Max;
    fVar12 = IVar2.x;
    fVar13 = IVar2.y;
    fVar14 = IVar1.x;
    fVar15 = IVar1.y;
    fVar16 = (fVar13 - fVar15) * (fVar12 - fVar14);
    if (fVar16 <= pIVar8->DragDropAcceptIdCurrRectSurface) {
      pIVar8->DragDropAcceptFlags = flags;
      pIVar8->DragDropAcceptIdCurr = IVar4;
      pIVar8->DragDropAcceptIdCurrRectSurface = fVar16;
    }
    (pIVar8->DragDropPayload).Preview = IVar3 == IVar4;
    if (((pIVar8->DragDropSourceFlags | flags) & 0x800U) == 0 && IVar3 == IVar4) {
      this = pIVar5->DrawList;
      local_58.x = fVar14 + -3.5;
      local_58.y = fVar15 + -3.5;
      local_50.y = fVar13 + 3.5;
      local_50.x = fVar12 + 3.5;
      local_48.x = (pIVar8->Style).Colors[0x30].x;
      local_48.y = (pIVar8->Style).Colors[0x30].y;
      uVar6 = (pIVar8->Style).Colors[0x30].z;
      uVar7 = (pIVar8->Style).Colors[0x30].w;
      local_48.w = (pIVar8->Style).Alpha * (float)uVar7;
      local_48.z = (float)uVar6;
      col = ColorConvertFloat4ToU32(&local_48);
      ImDrawList::AddRect(this,&local_58,&local_50,col,0.0,0,2.0);
    }
    pIVar8->DragDropAcceptFrameCount = pIVar8->FrameCount;
    if (IVar3 == IVar4) {
      if ((GImGui->IO).MouseDown[pIVar8->DragDropMouseButton] == false) {
        (pIVar8->DragDropPayload).Delivery = true;
      }
      else {
        bVar9 = TestKeyOwner(pIVar8->DragDropMouseButton + ImGuiKey_MouseLeft,0);
        (pIVar8->DragDropPayload).Delivery = !bVar9;
        if (((uint)flags >> 10 & 1) == 0 && bVar9) goto LAB_001f5b01;
      }
    }
    else {
      (pIVar8->DragDropPayload).Delivery = false;
      if (((uint)flags >> 10 & 1) == 0) goto LAB_001f5b01;
    }
    pIVar11 = &pIVar8->DragDropPayload;
  }
  else {
LAB_001f5b01:
    pIVar11 = (ImGuiPayload *)0x0;
  }
  return pIVar11;
}

Assistant:

const ImGuiPayload* ImGui::AcceptDragDropPayload(const char* type, ImGuiDragDropFlags flags)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    ImGuiPayload& payload = g.DragDropPayload;
    IM_ASSERT(g.DragDropActive);                        // Not called between BeginDragDropTarget() and EndDragDropTarget() ?
    IM_ASSERT(payload.DataFrameCount != -1);            // Forgot to call EndDragDropTarget() ?
    if (type != NULL && !payload.IsDataType(type))
        return NULL;

    // Accept smallest drag target bounding box, this allows us to nest drag targets conveniently without ordering constraints.
    // NB: We currently accept NULL id as target. However, overlapping targets requires a unique ID to function!
    const bool was_accepted_previously = (g.DragDropAcceptIdPrev == g.DragDropTargetId);
    ImRect r = g.DragDropTargetRect;
    float r_surface = r.GetWidth() * r.GetHeight();
    if (r_surface <= g.DragDropAcceptIdCurrRectSurface)
    {
        g.DragDropAcceptFlags = flags;
        g.DragDropAcceptIdCurr = g.DragDropTargetId;
        g.DragDropAcceptIdCurrRectSurface = r_surface;
    }

    // Render default drop visuals
    payload.Preview = was_accepted_previously;
    flags |= (g.DragDropSourceFlags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect); // Source can also inhibit the preview (useful for external sources that live for 1 frame)
    if (!(flags & ImGuiDragDropFlags_AcceptNoDrawDefaultRect) && payload.Preview)
        window->DrawList->AddRect(r.Min - ImVec2(3.5f,3.5f), r.Max + ImVec2(3.5f, 3.5f), GetColorU32(ImGuiCol_DragDropTarget), 0.0f, 0, 2.0f);

    g.DragDropAcceptFrameCount = g.FrameCount;
    payload.Delivery = was_accepted_previously && !IsMouseDown(g.DragDropMouseButton); // For extern drag sources affecting os window focus, it's easier to just test !IsMouseDown() instead of IsMouseReleased()
    if (!payload.Delivery && !(flags & ImGuiDragDropFlags_AcceptBeforeDelivery))
        return NULL;

    return &payload;
}